

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_channels(exr_context_t ctxt,int part_index,exr_attr_chlist_t *channels)

{
  _internal_exr_part *p_Var1;
  exr_attr_box2i_t *peVar2;
  exr_result_t eVar3;
  long in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_attr_chlist_t clist;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_50;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_48;
  uint in_stack_ffffffffffffffd0;
  exr_attribute_t *ctxt_00;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX == 0) {
    eVar3 = (*in_RDI->report_error)(in_RDI,3,"No channels provided for channel list");
  }
  else {
    eVar3 = 0;
    if (in_RDI == (_internal_exr_context *)0x0) {
      eVar3 = 2;
    }
    else {
      p_Var4 = in_RDI;
      internal_exr_lock(in_RDI);
      if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
        internal_exr_unlock(in_RDI);
        eVar3 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
      }
      else {
        p_Var1 = in_RDI->parts[(int)in_ESI];
        if (in_RDI->mode == '\0') {
          internal_exr_unlock(in_RDI);
          eVar3 = (*in_RDI->standard_error)(in_RDI,8);
        }
        else if (in_RDI->mode == '\x03') {
          internal_exr_unlock(in_RDI);
          eVar3 = (*in_RDI->standard_error)(in_RDI,0x15);
        }
        else {
          if (p_Var1->channels == (exr_attribute_t *)0x0) {
            eVar3 = exr_attr_list_add((exr_context_t)clist._0_8_,unaff_retaddr,
                                      (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8),
                                      (exr_attribute_type_t)((ulong)p_Var4 >> 0x20),(int32_t)p_Var4,
                                      (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      (exr_attribute_t **)pctxt);
          }
          else if (p_Var1->channels->type != EXR_ATTR_CHLIST) {
            internal_exr_unlock(in_RDI);
            eVar3 = (*in_RDI->print_error)
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               p_Var1->channels->type_name,"channels");
            return eVar3;
          }
          ctxt_00 = p_Var1->channels;
          if (eVar3 == 0) {
            eVar3 = exr_attr_chlist_duplicate
                              ((exr_context_t)ctxt_00,
                               (exr_attr_chlist_t *)(ulong)in_stack_ffffffffffffffd0,
                               (exr_attr_chlist_t *)in_RDI);
            if (eVar3 != 0) {
              internal_exr_unlock(in_RDI);
              return eVar3;
            }
            exr_attr_chlist_destroy
                      ((exr_context_t)ctxt_00,(exr_attr_chlist_t *)(ulong)in_stack_ffffffffffffffd0)
            ;
            peVar2 = (ctxt_00->field_6).box2i;
            (peVar2->min).field_0 = local_50;
            (peVar2->max).field_0 = local_48;
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_set_channels (
    exr_context_t ctxt, int part_index, const exr_attr_chlist_t* channels)
{
    if (!channels)
        return EXR_CTXT (ctxt)->report_error (
            EXR_CTXT (ctxt),
            EXR_ERR_INVALID_ARGUMENT,
            "No channels provided for channel list");

    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;

        rv = exr_attr_chlist_duplicate (ctxt, &clist, channels);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}